

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcm2wav.cc
# Opt level: O1

void __thiscall
ConvertorPCM2WAV::ConvertorPCM2WAV
          (ConvertorPCM2WAV *this,PBuffer *_buffer,size_t _chenals,size_t _rate)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (_buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (_buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_Convertor)._vptr_Convertor = (_func_int **)&PTR__Convertor_001571d0;
    (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    (this->super_Convertor)._vptr_Convertor = (_func_int **)&PTR__Convertor_001571d0;
    (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0013f5de;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_0013f5de:
  (this->super_Convertor)._vptr_Convertor = (_func_int **)&PTR__ConvertorPCM2WAV_00157bd0;
  (this->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->chenals = _chenals;
  this->rate = _rate;
  return;
}

Assistant:

ConvertorPCM2WAV::ConvertorPCM2WAV(PBuffer _buffer,
                                   size_t _chenals,
                                   size_t _rate)
  : Convertor(_buffer)
  , chenals(_chenals)
  , rate(_rate) {
}